

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_cvttpd2dq_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  byte bVar1;
  byte bVar2;
  float64 fVar3;
  uint32_t uVar4;
  
  fVar3 = s->_d_ZMMReg[0];
  bVar1 = (env->sse_status).float_exception_flags;
  (env->sse_status).float_exception_flags = '\0';
  uVar4 = float64_to_int32_round_to_zero_x86_64(fVar3,&env->sse_status);
  bVar2 = (env->sse_status).float_exception_flags;
  if ((bVar2 & 1) != 0) {
    uVar4 = 0x80000000;
  }
  (env->sse_status).float_exception_flags = bVar1 | bVar2;
  d->_l_ZMMReg[0] = uVar4;
  fVar3 = s->_d_ZMMReg[1];
  bVar1 = (env->sse_status).float_exception_flags;
  (env->sse_status).float_exception_flags = '\0';
  uVar4 = float64_to_int32_round_to_zero_x86_64(fVar3,&env->sse_status);
  bVar2 = (env->sse_status).float_exception_flags;
  if ((bVar2 & 1) != 0) {
    uVar4 = 0x80000000;
  }
  (env->sse_status).float_exception_flags = bVar1 | bVar2;
  d->_l_ZMMReg[1] = uVar4;
  d->_q_ZMMReg[1] = 0;
  return;
}

Assistant:

void helper_cvttpd2dq(CPUX86State *env, ZMMReg *d, ZMMReg *s)
{
    d->ZMM_L(0) = x86_float64_to_int32_round_to_zero(s->ZMM_D(0), &env->sse_status);
    d->ZMM_L(1) = x86_float64_to_int32_round_to_zero(s->ZMM_D(1), &env->sse_status);
    d->ZMM_Q(1) = 0;
}